

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O2

void duckdb::Node15Leaf::InsertByte(ART *art,Node *node,uint8_t byte)

{
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *n;
  Node node15;
  
  n = &Node::Ref<duckdb::Node15Leaf>(art,(Node)(node->super_IndexPointer).data,NODE_15_LEAF)->
       super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>;
  if (n->count == '\x0f') {
    node15 = (Node)(node->super_IndexPointer).data;
    Node256Leaf::GrowNode15Leaf(art,node,&node15);
    Node256Leaf::InsertByte(art,node,byte);
    return;
  }
  BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::InsertByteInternal(n,byte);
  return;
}

Assistant:

void Node15Leaf::InsertByte(ART &art, Node &node, const uint8_t byte) {
	// The node is full. Grow to Node256Leaf.
	auto &n15 = Node::Ref<Node15Leaf>(art, node, NODE_15_LEAF);
	if (n15.count == CAPACITY) {
		auto node15 = node;
		Node256Leaf::GrowNode15Leaf(art, node, node15);
		Node256Leaf::InsertByte(art, node, byte);
		return;
	}

	InsertByteInternal(n15, byte);
}